

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O0

void __thiscall spv::Builder::postProcess(Builder *this,Instruction *inst)

{
  anon_class_24_3_861477ca __f;
  anon_class_16_2_769e8199 __f_00;
  bool bVar1;
  Op OVar2;
  uint uVar3;
  int iVar4;
  Id IVar5;
  int iVar6;
  Instruction *pIVar7;
  iterator iVar8;
  iterator iVar9;
  int local_f4;
  uint local_f0;
  int op;
  int alignmentIdx;
  uint memoryAccess;
  anon_class_16_2_769e8199 function_1;
  anon_class_24_3_861477ca function;
  uint c;
  Instruction *idx;
  int i;
  int alignment;
  Instruction *type;
  Instruction *pIStack_28;
  Id typeId;
  Instruction *base;
  Instruction *accessChain;
  Instruction *inst_local;
  Builder *this_local;
  
  accessChain = inst;
  inst_local = (Instruction *)this;
  OVar2 = spv::Instruction::getOpCode(inst);
  if (OVar2 == OpExtInst) {
    uVar3 = spv::Instruction::getImmediateOperand(accessChain,1);
    if (uVar3 - 0x4c < 3) {
      addCapability(this,CapabilityInterpolationFunction);
    }
  }
  else if (OVar2 - OpLoad < 2) {
    IVar5 = spv::Instruction::getIdOperand(accessChain,0);
    base = Module::getInstruction(&this->module,IVar5);
    OVar2 = spv::Instruction::getOpCode(base);
    if (OVar2 == OpAccessChain) {
      IVar5 = spv::Instruction::getIdOperand(base,0);
      pIStack_28 = Module::getInstruction(&this->module,IVar5);
      type._4_4_ = spv::Instruction::getTypeId(pIStack_28);
      _i = Module::getInstruction(&this->module,type._4_4_);
      OVar2 = spv::Instruction::getOpCode(_i);
      if (OVar2 != OpTypePointer) {
        __assert_fail("type->getOpCode() == OpTypePointer",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                      ,0xff,"void spv::Builder::postProcess(Instruction &)");
      }
      uVar3 = spv::Instruction::getImmediateOperand(_i,0);
      if (uVar3 == 0x14e5) {
        type._4_4_ = spv::Instruction::getIdOperand(_i,1);
        _i = Module::getInstruction(&this->module,type._4_4_);
        idx._4_4_ = 0;
        for (idx._0_4_ = 1; iVar6 = (int)idx, iVar4 = spv::Instruction::getNumOperands(base),
            iVar6 < iVar4; idx._0_4_ = (int)idx + 1) {
          IVar5 = spv::Instruction::getIdOperand(base,(int)idx);
          pIVar7 = Module::getInstruction(&this->module,IVar5);
          OVar2 = spv::Instruction::getOpCode(_i);
          if (OVar2 == OpTypeStruct) {
            OVar2 = spv::Instruction::getOpCode(pIVar7);
            if (OVar2 != OpConstant) {
              __assert_fail("idx->getOpCode() == OpConstant",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                            ,0x10e,"void spv::Builder::postProcess(Instruction &)");
            }
            function.alignment._4_4_ = spv::Instruction::getImmediateOperand(pIVar7,0);
            function.typeId = (Id *)((long)&function.alignment + 4);
            function.c = (uint *)((long)&idx + 4);
            iVar8 = std::
                    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                    ::begin(&this->decorations);
            iVar9 = std::
                    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                    ::end(&this->decorations);
            __f.c = function.typeId;
            __f.typeId = (Id *)((long)&type + 4);
            __f.alignment = (int *)function.c;
            std::
            for_each<std::_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>,spv::Builder::postProcess(spv::Instruction&)::__0>
                      ((anon_class_24_3_861477ca *)&function_1.alignment,
                       (_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
                        )iVar8._M_node,
                       (_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
                        )iVar9._M_node,__f);
            type._4_4_ = spv::Instruction::getIdOperand(_i,function.alignment._4_4_);
            _i = Module::getInstruction(&this->module,type._4_4_);
          }
          else {
            OVar2 = spv::Instruction::getOpCode(_i);
            if ((OVar2 != OpTypeArray) &&
               (OVar2 = spv::Instruction::getOpCode(_i), OVar2 != OpTypeRuntimeArray)) break;
            function_1.typeId = (Id *)((long)&idx + 4);
            iVar8 = std::
                    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                    ::begin(&this->decorations);
            iVar9 = std::
                    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                    ::end(&this->decorations);
            __f_00.alignment = (int *)function_1.typeId;
            __f_00.typeId = (Id *)((long)&type + 4);
            std::
            for_each<std::_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>,spv::Builder::postProcess(spv::Instruction&)::__1>
                      ((_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
                        )iVar8._M_node,
                       (_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
                        )iVar9._M_node,__f_00);
            type._4_4_ = spv::Instruction::getIdOperand(_i,0);
            _i = Module::getInstruction(&this->module,type._4_4_);
          }
        }
        iVar6 = spv::Instruction::getNumOperands(accessChain);
        pIVar7 = accessChain;
        if (iVar6 < 3) {
          __assert_fail("inst.getNumOperands() >= 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                        ,0x130,"void spv::Builder::postProcess(Instruction &)");
        }
        OVar2 = spv::Instruction::getOpCode(accessChain);
        iVar6 = 1;
        if (OVar2 == OpStore) {
          iVar6 = 2;
        }
        uVar3 = spv::Instruction::getImmediateOperand(pIVar7,iVar6);
        if ((uVar3 & 2) == 0) {
          __assert_fail("memoryAccess & MemoryAccessAlignedMask",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                        ,0x132,"void spv::Builder::postProcess(Instruction &)");
        }
        local_f0 = 2;
        OVar2 = spv::Instruction::getOpCode(accessChain);
        if (OVar2 == OpStore) {
          local_f0 = 3;
        }
        uVar3 = spv::Instruction::getImmediateOperand(accessChain,local_f0);
        uVar3 = uVar3 | idx._4_4_;
        idx._4_4_ = uVar3 & (uVar3 & uVar3 - 1 ^ 0xffffffff);
        spv::Instruction::setImmediateOperand(accessChain,local_f0,idx._4_4_);
      }
    }
  }
  else if (OVar2 - OpImageQuerySizeLod < 5) {
    addCapability(this,CapabilityImageQuery);
  }
  else if (OVar2 - OpDPdxFine < 6) {
    addCapability(this,CapabilityDerivativeControl);
  }
  else if (OVar2 == OpGroupNonUniformPartitionNV) {
    addExtension(this,"SPV_NV_shader_subgroup_partitioned");
    addCapability(this,CapabilityGroupNonUniformPartitionedNV);
  }
  IVar5 = spv::Instruction::getTypeId(accessChain);
  pIVar7 = accessChain;
  if (IVar5 != 0) {
    IVar5 = spv::Instruction::getTypeId(accessChain);
    postProcessType(this,pIVar7,IVar5);
  }
  for (local_f4 = 0; iVar6 = spv::Instruction::getNumOperands(accessChain), local_f4 < iVar6;
      local_f4 = local_f4 + 1) {
    bVar1 = spv::Instruction::isIdOperand(accessChain,local_f4);
    if (bVar1) {
      IVar5 = spv::Instruction::getIdOperand(accessChain,local_f4);
      IVar5 = getTypeId(this,IVar5);
      pIVar7 = accessChain;
      if (IVar5 != 0) {
        IVar5 = spv::Instruction::getIdOperand(accessChain,local_f4);
        IVar5 = getTypeId(this,IVar5);
        postProcessType(this,pIVar7,IVar5);
      }
    }
  }
  return;
}

Assistant:

void Builder::postProcess(Instruction& inst)
{
    // Add capabilities based simply on the opcode.
    switch (inst.getOpCode()) {
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            addCapability(CapabilityInterpolationFunction);
            break;
        default:
            break;
        }
        break;
    case OpDPdxFine:
    case OpDPdyFine:
    case OpFwidthFine:
    case OpDPdxCoarse:
    case OpDPdyCoarse:
    case OpFwidthCoarse:
        addCapability(CapabilityDerivativeControl);
        break;

    case OpImageQueryLod:
    case OpImageQuerySize:
    case OpImageQuerySizeLod:
    case OpImageQuerySamples:
    case OpImageQueryLevels:
        addCapability(CapabilityImageQuery);
        break;

    case OpGroupNonUniformPartitionNV:
        addExtension(E_SPV_NV_shader_subgroup_partitioned);
        addCapability(CapabilityGroupNonUniformPartitionedNV);
        break;

    case OpLoad:
    case OpStore:
        {
            // For any load/store to a PhysicalStorageBufferEXT, walk the accesschain
            // index list to compute the misalignment. The pre-existing alignment value
            // (set via Builder::AccessChain::alignment) only accounts for the base of
            // the reference type and any scalar component selection in the accesschain,
            // and this function computes the rest from the SPIR-V Offset decorations.
            Instruction *accessChain = module.getInstruction(inst.getIdOperand(0));
            if (accessChain->getOpCode() == OpAccessChain) {
                Instruction *base = module.getInstruction(accessChain->getIdOperand(0));
                // Get the type of the base of the access chain. It must be a pointer type.
                Id typeId = base->getTypeId();
                Instruction *type = module.getInstruction(typeId);
                assert(type->getOpCode() == OpTypePointer);
                if (type->getImmediateOperand(0) != StorageClassPhysicalStorageBufferEXT) {
                    break;
                }
                // Get the pointee type.
                typeId = type->getIdOperand(1);
                type = module.getInstruction(typeId);
                // Walk the index list for the access chain. For each index, find any
                // misalignment that can apply when accessing the member/element via
                // Offset/ArrayStride/MatrixStride decorations, and bitwise OR them all
                // together.
                int alignment = 0;
                for (int i = 1; i < accessChain->getNumOperands(); ++i) {
                    Instruction *idx = module.getInstruction(accessChain->getIdOperand(i));
                    if (type->getOpCode() == OpTypeStruct) {
                        assert(idx->getOpCode() == OpConstant);
                        unsigned int c = idx->getImmediateOperand(0);

                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpMemberDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == c &&
                                (decoration.get()->getImmediateOperand(2) == DecorationOffset ||
                                 decoration.get()->getImmediateOperand(2) == DecorationMatrixStride)) {
                                alignment |= decoration.get()->getImmediateOperand(3);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // get the next member type
                        typeId = type->getIdOperand(c);
                        type = module.getInstruction(typeId);
                    } else if (type->getOpCode() == OpTypeArray ||
                               type->getOpCode() == OpTypeRuntimeArray) {
                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == DecorationArrayStride) {
                                alignment |= decoration.get()->getImmediateOperand(2);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // Get the element type
                        typeId = type->getIdOperand(0);
                        type = module.getInstruction(typeId);
                    } else {
                        // Once we get to any non-aggregate type, we're done.
                        break;
                    }
                }
                assert(inst.getNumOperands() >= 3);
                unsigned int memoryAccess = inst.getImmediateOperand((inst.getOpCode() == OpStore) ? 2 : 1);
                assert(memoryAccess & MemoryAccessAlignedMask);
                static_cast<void>(memoryAccess);
                // Compute the index of the alignment operand.
                int alignmentIdx = 2;
                if (inst.getOpCode() == OpStore)
                    alignmentIdx++;
                // Merge new and old (mis)alignment
                alignment |= inst.getImmediateOperand(alignmentIdx);
                // Pick the LSB
                alignment = alignment & ~(alignment & (alignment-1));
                // update the Aligned operand
                inst.setImmediateOperand(alignmentIdx, alignment);
            }
            break;
        }

    default:
        break;
    }

    // Checks based on type
    if (inst.getTypeId() != NoType)
        postProcessType(inst, inst.getTypeId());
    for (int op = 0; op < inst.getNumOperands(); ++op) {
        if (inst.isIdOperand(op)) {
            // In blocks, these are always result ids, but we are relying on
            // getTypeId() to return NoType for things like OpLabel.
            if (getTypeId(inst.getIdOperand(op)) != NoType)
                postProcessType(inst, getTypeId(inst.getIdOperand(op)));
        }
    }
}